

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mips16_save(DisasContext_conflict6 *ctx,int xsregs,int aregs,int do_ra,int do_s0,int do_s1,
                    int framesize)

{
  TCGContext_conflict6 *s;
  TCGContext_conflict6 *pTVar1;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGTemp *a1_01;
  long lVar2;
  uintptr_t o_35;
  uintptr_t o_3;
  TCGv_i64 addr;
  uintptr_t o_37;
  TCGv_i64 val;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  a1_01 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  if (0xe < (uint)aregs) {
    generate_exception_err(ctx,0x14,0);
    return;
  }
  addr = (TCGv_i64)((long)a1 - (long)s);
  val = (TCGv_i64)((long)a1_00 - (long)s);
  switch((ulong)(uint)aregs) {
  case 0xe:
    gen_base_offset_addr(ctx,addr,0x1d,0xc);
    if (s->cpu_gpr[7] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[7] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  case 0xc:
  case 0xd:
    gen_base_offset_addr(ctx,addr,0x1d,8);
    if (s->cpu_gpr[6] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[6] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  case 8:
  case 9:
  case 10:
    gen_base_offset_addr(ctx,addr,0x1d,4);
    if (s->cpu_gpr[5] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[5] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  case 4:
  case 5:
  case 6:
  case 7:
    pTVar1 = ctx->uc->tcg_ctx;
    if (pTVar1->cpu_gpr[0x1d] != addr) {
      tcg_gen_op2_mips64el
                (pTVar1,INDEX_op_mov_i64,(TCGArg)((long)pTVar1 + (long)addr),
                 (TCGArg)(pTVar1->cpu_gpr[0x1d] + (long)pTVar1));
    }
    if (s->cpu_gpr[4] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[4] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  default:
    if (s->cpu_gpr[0x1d] != addr) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1,(TCGArg)(s->cpu_gpr[0x1d] + (long)s));
    }
    lVar2 = (long)a1_01 - (long)s;
    if (do_ra != 0) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_01,0xfffffffffffffffc);
      pTVar1 = ctx->uc->tcg_ctx;
      tcg_gen_op3_mips64el
                (pTVar1,INDEX_op_add_i64,(TCGArg)(addr + (long)pTVar1),(TCGArg)(addr + (long)pTVar1)
                 ,(long)pTVar1 + lVar2);
      if ((ctx->hflags & 0x200) != 0) {
        tcg_gen_ext32s_i64_mips64el(pTVar1,addr,addr);
      }
      if (s->cpu_gpr[0x1f] != val) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[0x1f] + (long)s));
      }
      tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
    }
  }
  switch(xsregs) {
  case 7:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_01,0xfffffffffffffffc);
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (pTVar1,INDEX_op_add_i64,(TCGArg)(addr + (long)pTVar1),(TCGArg)(addr + (long)pTVar1),
               (long)pTVar1 + lVar2);
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(pTVar1,addr,addr);
    }
    if (s->cpu_gpr[0x1e] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[0x1e] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  case 6:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_01,0xfffffffffffffffc);
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (pTVar1,INDEX_op_add_i64,(TCGArg)(addr + (long)pTVar1),(TCGArg)(addr + (long)pTVar1),
               (long)pTVar1 + lVar2);
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(pTVar1,addr,addr);
    }
    if (s->cpu_gpr[0x17] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[0x17] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  case 5:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_01,0xfffffffffffffffc);
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (pTVar1,INDEX_op_add_i64,(TCGArg)(addr + (long)pTVar1),(TCGArg)(addr + (long)pTVar1),
               (long)pTVar1 + lVar2);
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(pTVar1,addr,addr);
    }
    if (s->cpu_gpr[0x16] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[0x16] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  case 4:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_01,0xfffffffffffffffc);
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (pTVar1,INDEX_op_add_i64,(TCGArg)(addr + (long)pTVar1),(TCGArg)(addr + (long)pTVar1),
               (long)pTVar1 + lVar2);
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(pTVar1,addr,addr);
    }
    if (s->cpu_gpr[0x15] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[0x15] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  case 3:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_01,0xfffffffffffffffc);
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (pTVar1,INDEX_op_add_i64,(TCGArg)(addr + (long)pTVar1),(TCGArg)(addr + (long)pTVar1),
               (long)pTVar1 + lVar2);
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(pTVar1,addr,addr);
    }
    if (s->cpu_gpr[0x14] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[0x14] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  case 2:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_01,0xfffffffffffffffc);
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (pTVar1,INDEX_op_add_i64,(TCGArg)(addr + (long)pTVar1),(TCGArg)(addr + (long)pTVar1),
               (long)pTVar1 + lVar2);
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(pTVar1,addr,addr);
    }
    if (s->cpu_gpr[0x13] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[0x13] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  case 1:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_01,0xfffffffffffffffc);
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (pTVar1,INDEX_op_add_i64,(TCGArg)(addr + (long)pTVar1),(TCGArg)(addr + (long)pTVar1),
               (long)pTVar1 + lVar2);
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(pTVar1,addr,addr);
    }
    if (s->cpu_gpr[0x12] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[0x12] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
  default:
    if (do_s1 != 0) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_01,0xfffffffffffffffc);
      pTVar1 = ctx->uc->tcg_ctx;
      tcg_gen_op3_mips64el
                (pTVar1,INDEX_op_add_i64,(TCGArg)(addr + (long)pTVar1),(TCGArg)(addr + (long)pTVar1)
                 ,(long)pTVar1 + lVar2);
      if ((ctx->hflags & 0x200) != 0) {
        tcg_gen_ext32s_i64_mips64el(pTVar1,addr,addr);
      }
      if (s->cpu_gpr[0x11] != val) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[0x11] + (long)s));
      }
      tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
    }
    if (do_s0 != 0) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_01,0xfffffffffffffffc);
      pTVar1 = ctx->uc->tcg_ctx;
      tcg_gen_op3_mips64el
                (pTVar1,INDEX_op_add_i64,(TCGArg)(addr + (long)pTVar1),(TCGArg)(addr + (long)pTVar1)
                 ,(long)pTVar1 + lVar2);
      if ((ctx->hflags & 0x200) != 0) {
        tcg_gen_ext32s_i64_mips64el(pTVar1,addr,addr);
      }
      if (s->cpu_gpr[0x10] != val) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[0x10] + (long)s));
      }
      tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
    }
    (*(code *)(&DAT_00da1464 + *(int *)(&DAT_00da1464 + (ulong)(uint)aregs * 4)))();
    return;
  }
}

Assistant:

static void gen_mips16_save(DisasContext *ctx,
                            int xsregs, int aregs,
                            int do_ra, int do_s0, int do_s1,
                            int framesize)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    TCGv t2 = tcg_temp_new(tcg_ctx);
    int args, astatic;

    switch (aregs) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 11:
        args = 0;
        break;
    case 4:
    case 5:
    case 6:
    case 7:
        args = 1;
        break;
    case 8:
    case 9:
    case 10:
        args = 2;
        break;
    case 12:
    case 13:
        args = 3;
        break;
    case 14:
        args = 4;
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    switch (args) {
    case 4:
        gen_base_offset_addr(ctx, t0, 29, 12);
        gen_load_gpr(tcg_ctx, t1, 7);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
        /* Fall through */
    case 3:
        gen_base_offset_addr(ctx, t0, 29, 8);
        gen_load_gpr(tcg_ctx, t1, 6);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
        /* Fall through */
    case 2:
        gen_base_offset_addr(ctx, t0, 29, 4);
        gen_load_gpr(tcg_ctx, t1, 5);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
        /* Fall through */
    case 1:
        gen_base_offset_addr(ctx, t0, 29, 0);
        gen_load_gpr(tcg_ctx, t1, 4);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
    }

    gen_load_gpr(tcg_ctx, t0, 29);

#define DECR_AND_STORE(reg) do {                                 \
        tcg_gen_movi_tl(tcg_ctx, t2, -4);                                 \
        gen_op_addr_add(ctx, t0, t0, t2);                        \
        gen_load_gpr(tcg_ctx, t1, reg);                                   \
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL); \
    } while (0)

    if (do_ra) {
        DECR_AND_STORE(31);
    }

    switch (xsregs) {
    case 7:
        DECR_AND_STORE(30);
        /* Fall through */
    case 6:
        DECR_AND_STORE(23);
        /* Fall through */
    case 5:
        DECR_AND_STORE(22);
        /* Fall through */
    case 4:
        DECR_AND_STORE(21);
        /* Fall through */
    case 3:
        DECR_AND_STORE(20);
        /* Fall through */
    case 2:
        DECR_AND_STORE(19);
        /* Fall through */
    case 1:
        DECR_AND_STORE(18);
    }

    if (do_s1) {
        DECR_AND_STORE(17);
    }
    if (do_s0) {
        DECR_AND_STORE(16);
    }

    switch (aregs) {
    case 0:
    case 4:
    case 8:
    case 12:
    case 14:
        astatic = 0;
        break;
    case 1:
    case 5:
    case 9:
    case 13:
        astatic = 1;
        break;
    case 2:
    case 6:
    case 10:
        astatic = 2;
        break;
    case 3:
    case 7:
        astatic = 3;
        break;
    case 11:
        astatic = 4;
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    if (astatic > 0) {
        DECR_AND_STORE(7);
        if (astatic > 1) {
            DECR_AND_STORE(6);
            if (astatic > 2) {
                DECR_AND_STORE(5);
                if (astatic > 3) {
                    DECR_AND_STORE(4);
                }
            }
        }
    }
#undef DECR_AND_STORE

    tcg_gen_movi_tl(tcg_ctx, t2, -framesize);
    gen_op_addr_add(ctx, tcg_ctx->cpu_gpr[29], tcg_ctx->cpu_gpr[29], t2);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
}